

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsTorsionSpringDamper::ChShaftsTorsionSpringDamper
          (ChShaftsTorsionSpringDamper *this,shared_ptr<chrono::ChShaft> *mshaftA,
          shared_ptr<chrono::ChShaft> *mshaftB,double mstiffness,double mdamping)

{
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&mshaftA->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&mshaftB->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  ChShaftsLoad::ChShaftsLoad
            (&this->super_ChShaftsLoad,(shared_ptr<chrono::ChShaft> *)&local_30,
             (shared_ptr<chrono::ChShaft> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_ChShaftsLoad).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_01170ce8;
  this->stiffness = mstiffness;
  this->damping = mdamping;
  this->rest_phase = 0.0;
  return;
}

Assistant:

chrono::ChShaftsTorsionSpringDamper::ChShaftsTorsionSpringDamper(std::shared_ptr<ChShaft> mshaftA,
                                                                 std::shared_ptr<ChShaft> mshaftB,
                                                                 const double mstiffness,
                                                                 const double mdamping)
    : ChShaftsLoad(mshaftA, mshaftB), stiffness(mstiffness), damping(mdamping), rest_phase(0.0) {}